

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O1

int vrna_params_load(char *fname,uint options)

{
  int iVar1;
  FILE *__stream;
  void *p;
  char *pcVar2;
  char **file_content;
  long lVar3;
  long lVar4;
  char **ppcVar5;
  
  __stream = fopen(fname,"r");
  if (__stream == (FILE *)0x0) {
    file_content = (char **)0x0;
    vrna_message_warning("read_parameter_file():Can\'t open file %s\n",fname);
  }
  else {
    p = vrna_alloc(0x40000);
    pcVar2 = vrna_read_line((FILE *)__stream);
    if (pcVar2 == (char *)0x0) {
      lVar4 = 0;
    }
    else {
      lVar3 = 0x8000;
      lVar4 = 0;
      do {
        if (lVar4 == lVar3) {
          lVar3 = lVar3 + 0x8000;
          p = vrna_realloc(p,(int)lVar3 * 8);
        }
        *(char **)((long)p + lVar4 * 8) = pcVar2;
        lVar4 = lVar4 + 1;
        pcVar2 = vrna_read_line((FILE *)__stream);
      } while (pcVar2 != (char *)0x0);
    }
    file_content = (char **)vrna_realloc(p,(int)lVar4 * 8 + 8);
    file_content[lVar4] = (char *)0x0;
    fclose(__stream);
  }
  if (file_content == (char **)0x0) {
    iVar1 = 0;
  }
  else {
    pcVar2 = vrna_basename(fname);
    iVar1 = set_parameters_from_string(file_content,pcVar2);
    free(pcVar2);
    pcVar2 = *file_content;
    ppcVar5 = file_content;
    while (pcVar2 != (char *)0x0) {
      ppcVar5 = ppcVar5 + 1;
      free(pcVar2);
      pcVar2 = *ppcVar5;
    }
    free(file_content);
  }
  return iVar1;
}

Assistant:

PUBLIC int
vrna_params_load(const char   fname[],
                 unsigned int options)
{
  char  *name, **file_content, **ptr;
  int   ret;

  ret           = 0;
  file_content  = file2array(fname);

  if (file_content) {
    name = vrna_basename(fname);

    ret = set_parameters_from_string(file_content,
                                     (const char *)name);

    free(name);
    for (ptr = file_content; *ptr != NULL; ptr++)
      free(*ptr);

    free(file_content);
  }

  return ret;
}